

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdialog.cpp
# Opt level: O0

void __thiscall QInputDialogPrivate::setListViewText(QInputDialogPrivate *this,QString *text)

{
  enum_type f1;
  QFlags<QItemSelectionModel::SelectionFlag> QVar1;
  QAbstractItemModel *pQVar2;
  QItemSelectionModel *pQVar3;
  QComboBox *in_RSI;
  QComboBox *in_RDI;
  long in_FS_OFFSET;
  int row;
  QModelIndex index;
  enum_type in_stack_ffffffffffffff80;
  enum_type in_stack_ffffffffffffff84;
  QString *in_stack_ffffffffffffff88;
  QFlagsStorage<Qt::MatchFlag> flags;
  undefined1 local_38 [24];
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  flags.i = (Int)((ulong)*(undefined8 *)&in_RDI[0x13].super_QWidget.field_0x18 >> 0x20);
  Qt::operator|(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80);
  f1 = QComboBox::findText(in_RDI,in_stack_ffffffffffffff88,(MatchFlags)flags.i);
  if (f1 != ~NoUpdate) {
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar2 = QComboBox::model(in_RSI);
    QModelIndex::QModelIndex((QModelIndex *)0x79bac3);
    (**(code **)(*(long *)pQVar2 + 0x60))(&local_20,pQVar2,f1,0,local_38);
    pQVar3 = QAbstractItemView::selectionModel
                       ((QAbstractItemView *)CONCAT44(f1,in_stack_ffffffffffffff80));
    QVar1 = ::operator|(f1,in_stack_ffffffffffffff80);
    (**(code **)(*(long *)pQVar3 + 0x60))
              (pQVar3,&local_20,
               QVar1.super_QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>.
               super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QInputDialogPrivate::setListViewText(const QString &text)
{
    int row = comboBox->findText(text);
    if (row != -1) {
        QModelIndex index(comboBox->model()->index(row, 0));
        listView->selectionModel()->setCurrentIndex(index, QItemSelectionModel::Clear
                                                         | QItemSelectionModel::SelectCurrent);
    }
}